

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_unroll_indent(yaml_parser_t *parser,ptrdiff_t column)

{
  yaml_token_t **tail;
  yaml_token_t **end;
  size_t sVar1;
  int *piVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  yaml_token_t *pyVar7;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  
  if (parser->flow_level != 0) {
    return 1;
  }
  if (column < parser->indent) {
    tail = &(parser->tokens).tail;
    end = &(parser->tokens).end;
    do {
      sVar1 = (parser->mark).column;
      local_3c = (undefined4)sVar1;
      uStack_38 = (undefined4)(sVar1 >> 0x20);
      sVar3 = (parser->mark).index;
      sVar1 = (parser->mark).line;
      uStack_48 = (undefined4)(sVar3 >> 0x20);
      uStack_44 = (undefined4)sVar1;
      uStack_40 = (undefined4)(sVar1 >> 0x20);
      sVar1 = (parser->mark).column;
      sVar4 = (parser->mark).index;
      sVar5 = (parser->mark).line;
      pyVar7 = *tail;
      if (pyVar7 == *end) {
        iVar6 = yaml_queue_extend(&(parser->tokens).start,&(parser->tokens).head,tail,end);
        if (iVar6 == 0) {
          parser->error = YAML_MEMORY_ERROR;
          return 0;
        }
        pyVar7 = *tail;
      }
      (parser->tokens).tail = pyVar7 + 1;
      pyVar7->type = YAML_BLOCK_END_TOKEN;
      *(undefined4 *)((long)&(pyVar7->start_mark).column + 4) = uStack_38;
      *(ulong *)((long)&(pyVar7->start_mark).index + 4) = CONCAT44(uStack_44,uStack_48);
      *(ulong *)((long)&(pyVar7->start_mark).line + 4) = CONCAT44(local_3c,uStack_40);
      *(undefined8 *)((long)&(pyVar7->data).tag.suffix + 4) = 0;
      *(size_t *)((long)&pyVar7->data + 0x14) = sVar3 << 0x20;
      *(undefined8 *)&pyVar7->field_0x4 = 0;
      *(undefined8 *)((long)&(pyVar7->data).alias.value + 4) = 0;
      (pyVar7->end_mark).index = sVar4;
      (pyVar7->end_mark).line = sVar5;
      (pyVar7->end_mark).column = sVar1;
      piVar2 = (parser->indents).top;
      (parser->indents).top = piVar2 + -1;
      iVar6 = piVar2[-1];
      parser->indent = iVar6;
    } while (column < iVar6);
  }
  return 1;
}

Assistant:

static int
yaml_parser_unroll_indent(yaml_parser_t *parser, ptrdiff_t column)
{
    yaml_token_t token;

    /* In the flow context, do nothing. */

    if (parser->flow_level)
        return 1;

    /* Loop through the indentation levels in the stack. */

    while (parser->indent > column)
    {
        /* Create a token and append it to the queue. */

        TOKEN_INIT(token, YAML_BLOCK_END_TOKEN, parser->mark, parser->mark);

        if (!ENQUEUE(parser, parser->tokens, token))
            return 0;

        /* Pop the indentation level. */

        parser->indent = POP(parser, parser->indents);
    }

    return 1;
}